

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O0

void __thiscall
llbuild::basic::StringList::StringList<llvm::StringRef>
          (StringList *this,ArrayRef<llvm::StringRef> values)

{
  iterator pSVar1;
  unsigned_long *puVar2;
  void *pvVar3;
  char *pcVar4;
  char *local_c8;
  StringRef value_1;
  iterator __end0_1;
  iterator __begin0_1;
  ArrayRef<llvm::StringRef> *__range3_1;
  char *p;
  StringRef value;
  iterator __end0;
  iterator __begin0;
  ArrayRef<llvm::StringRef> *__range3;
  StringList *this_local;
  ArrayRef<llvm::StringRef> values_local;
  void *P;
  size_t FindBegin;
  char local_21;
  char **local_20;
  long local_18;
  char **local_10;
  
  values_local.Data = (StringRef *)values.Length;
  this_local = (StringList *)values.Data;
  this->contents = (char *)0x0;
  this->size = 0;
  __end0 = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&this_local);
  pSVar1 = llvm::ArrayRef<llvm::StringRef>::end((ArrayRef<llvm::StringRef> *)&this_local);
  for (; __end0 != pSVar1; __end0 = __end0 + 1) {
    this->size = __end0->Length + 1 + this->size;
  }
  __range3_1 = (ArrayRef<llvm::StringRef> *)operator_new__(this->size + 1);
  this->contents = (char *)__range3_1;
  __end0_1 = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&this_local);
  value_1.Length =
       (size_t)llvm::ArrayRef<llvm::StringRef>::end((ArrayRef<llvm::StringRef> *)&this_local);
  while( true ) {
    if (__end0_1 == (iterator)value_1.Length) {
      *(undefined1 *)&__range3_1->Data = 0;
      return;
    }
    local_c8 = __end0_1->Data;
    value_1.Data = (char *)__end0_1->Length;
    local_20 = &local_c8;
    local_21 = '\0';
    FindBegin = 0;
    puVar2 = std::min<unsigned_long>(&FindBegin,(unsigned_long *)&value_1);
    pcVar4 = (char *)*puVar2;
    if ((pcVar4 < value_1.Data) &&
       (pvVar3 = memchr(local_c8 + (long)pcVar4,(int)local_21,(long)value_1.Data - (long)pcVar4),
       pvVar3 != (void *)0x0)) {
      local_18 = (long)pvVar3 - (long)local_c8;
    }
    else {
      local_18 = -1;
    }
    if (local_18 != -1) break;
    local_10 = &local_c8;
    memcpy(__range3_1,local_c8,(size_t)value_1.Data);
    values_local.Length = (size_type)&local_c8;
    pcVar4 = value_1.Data + (long)__range3_1;
    __range3_1 = (ArrayRef<llvm::StringRef> *)(pcVar4 + 1);
    *pcVar4 = '\0';
    __end0_1 = __end0_1 + 1;
  }
  __assert_fail("value.find(\'\\0\') == StringRef::npos",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/Basic/StringList.h"
                ,0x40,
                "llbuild::basic::StringList::StringList(const ArrayRef<StringType>) [StringType = llvm::StringRef]"
               );
}

Assistant:

explicit StringList(const ArrayRef<StringType> values) {
    // Construct the concatenated data.
    for (auto value: values) {
      size += value.size() + 1;
    }
    // Make sure to allocate at least 1 byte.
    char* p = nullptr;
    contents = p = new char[size + 1];
    for (auto value: values) {
      assert(value.find('\0') == StringRef::npos);
      memcpy(p, value.data(), value.size());
      p += value.size();
      *p++ = '\0';
    }
    *p = '\0';
  }